

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void codeAttach(Parse *pParse,int type,FuncDef *pFunc,Expr *pAuthArg,Expr *pFilename,Expr *pDbname,
               Expr *pKey)

{
  sqlite3 *db;
  int iVar1;
  Vdbe *p;
  char *zArg1;
  NameContext local_68;
  
  db = pParse->db;
  if (pParse->nErr == 0) {
    local_68.ncFlags = 0;
    local_68._42_6_ = 0;
    local_68.pWinSelect = (Select *)0x0;
    local_68.pNext = (NameContext *)0x0;
    local_68.nRef = 0;
    local_68.nErr = 0;
    local_68.pSrcList = (SrcList *)0x0;
    local_68.uNC.pEList = (ExprList *)0x0;
    local_68.pParse = pParse;
    if (pFilename == (Expr *)0x0) {
LAB_0017956d:
      if (pDbname != (Expr *)0x0) {
        if (pDbname->op == ';') {
          pDbname->op = 'j';
        }
        else {
          iVar1 = sqlite3ResolveExprNames(&local_68,pDbname);
          if (iVar1 != 0) goto LAB_001794ed;
        }
      }
      if (pKey != (Expr *)0x0) {
        if (pKey->op == ';') {
          pKey->op = 'j';
        }
        else {
          iVar1 = sqlite3ResolveExprNames(&local_68,pKey);
          if (iVar1 != 0) goto LAB_001794ed;
        }
      }
      if (pAuthArg != (Expr *)0x0) {
        if (pAuthArg->op == 'j') {
          zArg1 = (pAuthArg->u).zToken;
        }
        else {
          zArg1 = (char *)0x0;
        }
        iVar1 = sqlite3AuthCheck(pParse,type,zArg1,(char *)0x0,(char *)0x0);
        if (iVar1 != 0) goto LAB_001794ed;
      }
      p = sqlite3GetVdbe(pParse);
      if (pParse->nRangeReg < 4) {
        iVar1 = pParse->nMem + 1;
        pParse->nMem = pParse->nMem + 4;
      }
      else {
        iVar1 = pParse->iRangeReg;
        pParse->iRangeReg = iVar1 + 4;
        pParse->nRangeReg = pParse->nRangeReg + -4;
      }
      sqlite3ExprCode(pParse,pFilename,iVar1);
      sqlite3ExprCode(pParse,pDbname,iVar1 + 1);
      sqlite3ExprCode(pParse,pKey,iVar1 + 2);
      if (p != (Vdbe *)0x0) {
        iVar1 = sqlite3VdbeAddOp3(p,0x3f,0,(iVar1 + 3) - (int)pFunc->nArg,iVar1 + 3);
        sqlite3VdbeChangeP4(p,iVar1,&pFunc->nArg,-8);
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = (ushort)(byte)pFunc->nArg;
        }
        sqlite3VdbeAddOp3(p,0x9f,(uint)(type == 0x18),0,0);
      }
      goto LAB_001794ed;
    }
    if (pFilename->op == ';') {
      pFilename->op = 'j';
      goto LAB_0017956d;
    }
    iVar1 = sqlite3ResolveExprNames(&local_68,pFilename);
    if (iVar1 == 0) goto LAB_0017956d;
  }
  else {
LAB_001794ed:
    if (pFilename == (Expr *)0x0) goto LAB_001794fd;
  }
  sqlite3ExprDeleteNN(db,pFilename);
LAB_001794fd:
  if (pDbname != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pDbname);
  }
  if (pKey != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pKey);
  }
  return;
}

Assistant:

static void codeAttach(
  Parse *pParse,       /* The parser context */
  int type,            /* Either SQLITE_ATTACH or SQLITE_DETACH */
  FuncDef const *pFunc,/* FuncDef wrapper for detachFunc() or attachFunc() */
  Expr *pAuthArg,      /* Expression to pass to authorization callback */
  Expr *pFilename,     /* Name of database file */
  Expr *pDbname,       /* Name of the database to use internally */
  Expr *pKey           /* Database key for encryption extension */
){
  int rc;
  NameContext sName;
  Vdbe *v;
  sqlite3* db = pParse->db;
  int regArgs;

  if( pParse->nErr ) goto attach_end;
  memset(&sName, 0, sizeof(NameContext));
  sName.pParse = pParse;

  if( 
      SQLITE_OK!=(rc = resolveAttachExpr(&sName, pFilename)) ||
      SQLITE_OK!=(rc = resolveAttachExpr(&sName, pDbname)) ||
      SQLITE_OK!=(rc = resolveAttachExpr(&sName, pKey))
  ){
    goto attach_end;
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( pAuthArg ){
    char *zAuthArg;
    if( pAuthArg->op==TK_STRING ){
      zAuthArg = pAuthArg->u.zToken;
    }else{
      zAuthArg = 0;
    }
    rc = sqlite3AuthCheck(pParse, type, zAuthArg, 0, 0);
    if(rc!=SQLITE_OK ){
      goto attach_end;
    }
  }
#endif /* SQLITE_OMIT_AUTHORIZATION */


  v = sqlite3GetVdbe(pParse);
  regArgs = sqlite3GetTempRange(pParse, 4);
  sqlite3ExprCode(pParse, pFilename, regArgs);
  sqlite3ExprCode(pParse, pDbname, regArgs+1);
  sqlite3ExprCode(pParse, pKey, regArgs+2);

  assert( v || db->mallocFailed );
  if( v ){
    sqlite3VdbeAddOp4(v, OP_Function0, 0, regArgs+3-pFunc->nArg, regArgs+3,
                      (char *)pFunc, P4_FUNCDEF);
    assert( pFunc->nArg==-1 || (pFunc->nArg&0xff)==pFunc->nArg );
    sqlite3VdbeChangeP5(v, (u8)(pFunc->nArg));
 
    /* Code an OP_Expire. For an ATTACH statement, set P1 to true (expire this
    ** statement only). For DETACH, set it to false (expire all existing
    ** statements).
    */
    sqlite3VdbeAddOp1(v, OP_Expire, (type==SQLITE_ATTACH));
  }
  
attach_end:
  sqlite3ExprDelete(db, pFilename);
  sqlite3ExprDelete(db, pDbname);
  sqlite3ExprDelete(db, pKey);
}